

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O3

int run_test_connection_fail(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  int iVar3;
  long *plVar4;
  long *plVar5;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_80;
  long lStack_78;
  code *pcStack_70;
  undefined8 uStack_60;
  code *pcStack_58;
  long lStack_50;
  long lStack_48;
  long alStack_40 [2];
  undefined1 auStack_30 [16];
  code *pcStack_20;
  long local_18;
  long local_10;
  
  pcStack_20 = (code *)0x18421d;
  connection_fail(on_connect_with_close);
  local_10 = (long)timer_close_cb_calls;
  local_18 = 0;
  if (local_10 == 0) {
    local_10 = (long)timer_cb_calls;
    local_18 = 0;
    if (local_10 != 0) goto LAB_001842bf;
    pcStack_20 = (code *)0x184260;
    unaff_RBX = uv_default_loop();
    pcStack_20 = (code *)0x184274;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_20 = (code *)0x18427e;
    uv_run(unaff_RBX,0);
    local_10 = 0;
    pcStack_20 = (code *)0x18428c;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x184294;
    iVar1 = uv_loop_close(uVar2);
    local_18 = (long)iVar1;
    if (local_10 == local_18) {
      pcStack_20 = (code *)0x1842aa;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x1842bf;
    run_test_connection_fail_cold_1();
LAB_001842bf:
    pcStack_20 = (code *)0x1842cc;
    run_test_connection_fail_cold_2();
  }
  plVar4 = &local_10;
  pcStack_20 = connection_fail;
  run_test_connection_fail_cold_3();
  plVar5 = &lStack_50;
  pcStack_58 = (code *)0x1842f4;
  pcStack_20 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0,auStack_30);
  alStack_40[0] = (long)iVar1;
  lStack_50 = 0;
  if (alStack_40[0] == 0) {
    pcStack_58 = (code *)0x184328;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,alStack_40);
    lStack_50 = (long)iVar1;
    lStack_48 = 0;
    if (lStack_50 != 0) goto LAB_00184412;
    pcStack_58 = (code *)0x18434b;
    uVar2 = uv_default_loop();
    pcStack_58 = (code *)0x18435a;
    iVar1 = uv_tcp_init(uVar2,&tcp);
    if (iVar1 != 0) goto LAB_0018441f;
    pcStack_58 = (code *)0x184375;
    iVar1 = uv_tcp_bind(&tcp,auStack_30,0);
    lStack_50 = (long)iVar1;
    lStack_48 = 0;
    if (lStack_50 != 0) goto LAB_00184424;
    pcStack_58 = (code *)0x1843ae;
    iVar1 = uv_tcp_connect(&req,&tcp,alStack_40,plVar4);
    if (iVar1 != 0) goto LAB_00184431;
    pcStack_58 = (code *)0x1843b7;
    uVar2 = uv_default_loop();
    pcStack_58 = (code *)0x1843c1;
    uv_run(uVar2,0);
    lStack_50 = 1;
    lStack_48 = (long)connect_cb_calls;
    if (lStack_48 != 1) goto LAB_00184436;
    lStack_50 = 1;
    lStack_48 = (long)close_cb_calls;
    if (lStack_48 == 1) {
      return 1;
    }
  }
  else {
    pcStack_58 = (code *)0x184412;
    connection_fail_cold_1();
LAB_00184412:
    pcStack_58 = (code *)0x18441f;
    connection_fail_cold_2();
LAB_0018441f:
    pcStack_58 = (code *)0x184424;
    connection_fail_cold_3();
LAB_00184424:
    pcStack_58 = (code *)0x184431;
    connection_fail_cold_4();
LAB_00184431:
    pcStack_58 = (code *)0x184436;
    connection_fail_cold_5();
LAB_00184436:
    pcStack_58 = (code *)0x184443;
    connection_fail_cold_6();
  }
  iVar1 = (int)&lStack_48;
  pcStack_58 = on_connect_with_close;
  connection_fail_cold_7();
  if (*(uv_tcp_t **)((long)plVar5 + 0x50) == &tcp) {
    pcStack_58 = (code *)(long)iVar1;
    uStack_60 = 0xffffffffffffff91;
    if (pcStack_58 != (code *)0xffffffffffffff91) goto LAB_001844c4;
    connect_cb_calls = connect_cb_calls + 1;
    pcStack_58 = (code *)(long)close_cb_calls;
    uStack_60 = 0;
    if (pcStack_58 == (code *)0x0) {
      iVar1 = uv_close(&tcp,on_close);
      return iVar1;
    }
  }
  else {
    pcStack_70 = (code *)0x1844c4;
    on_connect_with_close_cold_1();
LAB_001844c4:
    pcStack_70 = (code *)0x1844d3;
    on_connect_with_close_cold_2();
  }
  pcStack_70 = run_test_connection_fail_doesnt_auto_close;
  on_connect_with_close_cold_3();
  iVar3 = (int)&lStack_80;
  pcStack_70 = (code *)plVar4;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&timer);
  lStack_78 = (long)iVar1;
  lStack_80 = 0;
  if (lStack_78 == 0) {
    connection_fail(on_connect_without_close);
    lStack_78 = 1;
    lStack_80 = (long)timer_close_cb_calls;
    if (lStack_80 != 1) goto LAB_001845cb;
    lStack_78 = 1;
    lStack_80 = (long)timer_cb_calls;
    if (lStack_80 == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_78 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      lStack_80 = (long)iVar1;
      if (lStack_78 == lStack_80) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001845e5;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_001845cb:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_001845e5:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar3 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return 0;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(connection_fail) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  connection_fail(on_connect_with_close);

  ASSERT_OK(timer_close_cb_calls);
  ASSERT_OK(timer_cb_calls);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}